

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O3

bool __thiscall
QGraphicsScenePrivate::sendEvent(QGraphicsScenePrivate *this,QGraphicsItem *item,QEvent *event)

{
  QEvent QVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  QGraphicsObject *pQVar5;
  
  pQVar5 = QGraphicsItem::toGraphicsObject(item);
  if (((pQVar5 != (QGraphicsObject *)0x0) &&
      (QApplicationPrivate::self->gestureManager != (QGestureManager *)0x0)) &&
     (bVar2 = QGestureManager::filterEvent
                        ((QGestureManager *)QApplicationPrivate::self->gestureManager,pQVar5,event),
     bVar2)) {
    return true;
  }
  bVar2 = filterEvent(this,item,event);
  if (((!bVar2) && (bVar2 = filterDescendantEvent(this,item,event), !bVar2)) &&
     (bVar2 = QGraphicsItem::isEnabled(item), bVar2)) {
    pQVar5 = QGraphicsItem::toGraphicsObject(item);
    if (pQVar5 != (QGraphicsObject *)0x0) {
      QVar1 = event[0xb];
      if (QVar1 == (QEvent)0x1) {
        cVar3 = qt_sendSpontaneousEvent(&pQVar5->super_QObject,event);
      }
      else {
        cVar3 = QCoreApplication::sendEvent(&pQVar5->super_QObject,event);
      }
      if (cVar3 != '\0') {
        return true;
      }
      event[0xb] = QVar1;
    }
    iVar4 = (*item->_vptr_QGraphicsItem[0xd])(item,event);
    return SUB41(iVar4,0);
  }
  return false;
}

Assistant:

bool QGraphicsScenePrivate::sendEvent(QGraphicsItem *item, QEvent *event)
{
#if QT_CONFIG(gestures)
    if (QGraphicsObject *object = item->toGraphicsObject()) {
        QGestureManager *gestureManager = QApplicationPrivate::instance()->gestureManager;
        if (gestureManager) {
            if (gestureManager->filterEvent(object, event))
                return true;
        }
    }
#endif // QT_CONFIG(gestures)

    if (filterEvent(item, event))
        return false;
    if (filterDescendantEvent(item, event))
        return false;
    if (!item || !item->isEnabled())
        return false;
    if (QGraphicsObject *o = item->toGraphicsObject()) {
        bool spont = event->spontaneous();
        if (spont ? qt_sendSpontaneousEvent(o, event) : QCoreApplication::sendEvent(o, event))
            return true;
        event->m_spont = spont;
    }
    return item->sceneEvent(event);
}